

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O2

void __thiscall
MathML::AST::ConstantExpression::setValue(ConstantExpression *this,String *str,Type type)

{
  char cVar1;
  long lVar2;
  double dVar3;
  
  if (type == SCALAR_BOOL) {
    if (str->_M_string_length != 0) {
      cVar1 = *(str->_M_dataplus)._M_p;
      dVar3 = 0.0;
      if ((cVar1 == 'f') || (cVar1 == 'F')) goto LAB_00854419;
    }
    dVar3 = 1.0;
  }
  else if (type == SCALAR_LONG) {
    lVar2 = StringUtil::parseLong(str);
    dVar3 = (double)lVar2;
  }
  else {
    if (type != SCALAR_DOUBLE) {
      return;
    }
    dVar3 = StringUtil::parseDouble(str);
  }
LAB_00854419:
  this->mValue = dVar3;
  this->mType = type;
  return;
}

Assistant:

void ConstantExpression::setValue( const String& str, Type type )
        {
            switch ( type )
            {

            case SCALAR_INVALID:
                break;

            case SCALAR_DOUBLE:
                mValue = StringUtil::parseDouble( str );
                mType = SCALAR_DOUBLE;
                //mValue = 1.0;
                break;

            case SCALAR_LONG:
                mValue = StringUtil::parseLong( str );
                mType = SCALAR_LONG;
                break;

            case SCALAR_BOOL:
                mValue = ( str.size() > 0 && ( str[ 0 ] == 'f' || str[ 0 ] == 'F' ) ) ? 0. : 1.;
                mType = SCALAR_BOOL;
                break;

            default:
                //@todo: exception
                break;
            }
        }